

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validity_mask.cpp
# Opt level: O3

void __thiscall duckdb::ValidityMask::Write(ValidityMask *this,WriteStream *writer,idx_t count)

{
  unsigned_long *puVar1;
  ValidityMask *pVVar2;
  idx_t iVar3;
  _func_int **pp_Var4;
  byte bVar5;
  undefined8 uVar6;
  ulong uVar7;
  undefined4 *puVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  undefined2 local_48;
  char local_46 [2];
  undefined4 local_44;
  ValidityMask *local_40;
  uint local_34;
  
  local_40 = this;
  iVar3 = TemplatedValidityMask<unsigned_long>::CountValid
                    (&this->super_TemplatedValidityMask<unsigned_long>,count);
  uVar11 = count - iVar3;
  uVar7 = count + 0x3f >> 3 & 0xfffffffffffffff8;
  bVar5 = 2 - (count < 0xffff);
  uVar10 = (iVar3 << (bVar5 & 0x3f)) + 4;
  uVar9 = (uVar11 << (bVar5 & 0x3f)) + 4;
  if (uVar9 < uVar7 || uVar10 < uVar7) {
    local_46[0] = '\x02' - (uVar10 < uVar9);
    (**writer->_vptr_WriteStream)(writer,local_46,1);
    if (iVar3 < uVar11) {
      uVar11 = iVar3;
    }
    local_34 = NumericCastImpl<unsigned_int,_unsigned_long,_false>::Convert(uVar11);
    (**writer->_vptr_WriteStream)(writer,&local_34,4);
    pVVar2 = local_40;
    if (count != 0) {
      uVar11 = 0;
      do {
        puVar1 = (pVVar2->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        if (puVar1 == (unsigned_long *)0x0) {
          if (uVar10 < uVar9) goto LAB_012fb5b4;
        }
        else if (((puVar1[uVar11 >> 6] >> (uVar11 & 0x3f) & 1) != 0) == uVar10 < uVar9) {
LAB_012fb5b4:
          if (count < 0xffff) {
            local_48 = (undefined2)uVar11;
            pp_Var4 = writer->_vptr_WriteStream;
            uVar6 = 2;
            puVar8 = (undefined4 *)&local_48;
          }
          else {
            local_44 = (undefined4)uVar11;
            pp_Var4 = writer->_vptr_WriteStream;
            uVar6 = 4;
            puVar8 = &local_44;
          }
          (**pp_Var4)(writer,puVar8,uVar6);
        }
        uVar11 = uVar11 + 1;
      } while (count != uVar11);
    }
  }
  else {
    local_46[1] = 0;
    (**writer->_vptr_WriteStream)(writer,local_46 + 1,1);
    (**writer->_vptr_WriteStream)
              (writer,(local_40->super_TemplatedValidityMask<unsigned_long>).validity_mask,uVar7);
  }
  return;
}

Assistant:

void ValidityMask::Write(WriteStream &writer, idx_t count) {
	auto valid_values = CountValid(count);
	auto invalid_values = count - valid_values;
	auto bitmask_bytes = ValidityMask::ValidityMaskSize(count);
	auto need_u32 = count >= NumericLimits<uint16_t>::Maximum();
	auto bytes_per_value = need_u32 ? sizeof(uint32_t) : sizeof(uint16_t);
	auto valid_value_size = bytes_per_value * valid_values + sizeof(uint32_t);
	auto invalid_value_size = bytes_per_value * invalid_values + sizeof(uint32_t);
	if (valid_value_size < bitmask_bytes || invalid_value_size < bitmask_bytes) {
		auto serialize_valid = valid_value_size < invalid_value_size;
		// serialize (in)valid value indexes as [COUNT][V0][V1][...][VN]
		auto flag = serialize_valid ? ValiditySerialization::VALID_VALUES : ValiditySerialization::INVALID_VALUES;
		writer.Write(flag);
		writer.Write<uint32_t>(NumericCast<uint32_t>(MinValue(valid_values, invalid_values)));
		for (idx_t i = 0; i < count; i++) {
			if (RowIsValid(i) == serialize_valid) {
				if (need_u32) {
					writer.Write<uint32_t>(UnsafeNumericCast<uint32_t>(i));
				} else {
					writer.Write<uint16_t>(UnsafeNumericCast<uint16_t>(i));
				}
			}
		}
	} else {
		// serialize the entire bitmask
		writer.Write(ValiditySerialization::BITMASK);
		writer.WriteData(const_data_ptr_cast(GetData()), bitmask_bytes);
	}
}